

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Resize
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,
          hash_t nhsize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  Node *block;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Node *pNVar7;
  long lVar8;
  
  uVar3 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar3 != 0) {
    lVar8 = 0;
    do {
      if (*(long *)((long)(block->Pair).Value.Args + lVar8 + -0x1c) != 1) {
        pNVar7 = NewKey(this,*(int *)((long)(block->Pair).Value.Args + lVar8 + -0x14));
        puVar1 = (undefined8 *)((long)(block->Pair).Value.Args + lVar8 + -0xc);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)(block->Pair).Value.Args + lVar8 + 4);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        (pNVar7->Pair).Value.Type = (PClassActor *)*puVar1;
        (pNVar7->Pair).Value.Special = (short)uVar4;
        (pNVar7->Pair).Value.ArgsDefined = (char)((ulong)uVar4 >> 0x10);
        (pNVar7->Pair).Value.field_0xb = (char)((ulong)uVar4 >> 0x18);
        (pNVar7->Pair).Value.Args[0] = (int)((ulong)uVar4 >> 0x20);
        *(undefined8 *)((pNVar7->Pair).Value.Args + 1) = uVar5;
        *(undefined8 *)((pNVar7->Pair).Value.Args + 3) = uVar6;
      }
      lVar8 = lVar8 + 0x30;
    } while ((ulong)uVar3 * 0x30 != lVar8);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}